

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O1

void __thiscall mir::inst::Value::display(Value *this,ostream *o)

{
  undefined1 *puVar1;
  ostream *poVar2;
  
  puVar1 = &this->field_0x8;
  if (this->field_0x18 == '\x01') {
    if ((this->field_0x18 != '\0') && (this->shift_amount != '\0')) {
      std::__ostream_insert<char,std::char_traits<char>>(o,"(",1);
    }
    (*(code *)**(undefined8 **)puVar1)(puVar1,o);
    if ((this->field_0x18 != '\0') && (this->shift_amount != '\0')) {
      std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
      arm::display_shift(o,this->shift);
      std::__ostream_insert<char,std::char_traits<char>>(o," ",1);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)o);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
      return;
    }
  }
  else if (this->field_0x18 == '\0') {
    std::ostream::operator<<(o,*(int *)puVar1);
    return;
  }
  return;
}

Assistant:

void Value::display(std::ostream& o) const {
  if (auto x = std::get_if<VarId>(this)) {
    if (has_shift()) {
      o << "(";
    }
    o << *x;
    if (has_shift()) {
      o << ", ";
      arm::display_shift(o, shift);
      o << " " << (unsigned int)shift_amount << ")";
    }
  } else if (auto x = std::get_if<int32_t>(this)) {
    o << *x;
  }
}